

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts3UpdateDocTotals(int *pRC,Fts3Table *p,u32 *aSzIns,u32 *aSzDel,int nChng)

{
  ulong uVar1;
  bool bVar2;
  byte bVar3;
  sqlite3_stmt *psVar4;
  byte *pbVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint *__s;
  Mem *pVal;
  void *pvVar10;
  long lVar11;
  ulong uVar12;
  byte *pbVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  long in_FS_OFFSET;
  sqlite3_stmt *pStmt;
  int local_88;
  sqlite3_stmt *local_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = (sqlite3_stmt *)&DAT_aaaaaaaaaaaaaaaa;
  if (*pRC == 0) {
    iVar9 = p->nColumn;
    uVar1 = (long)iVar9 + 2;
    iVar6 = sqlite3_initialize();
    if (iVar6 == 0) {
      __s = (uint *)sqlite3Malloc(uVar1 * 0xe);
    }
    else {
      __s = (uint *)0x0;
    }
    if (__s == (uint *)0x0) {
      *pRC = 7;
    }
    else {
      iVar6 = fts3SqlStmt(p,0x16,&local_48,(sqlite3_value **)0x0);
      psVar4 = local_48;
      if (iVar6 == 0) {
        uVar14 = 0;
        uVar8 = 0;
        sqlite3_bind_int64(local_48,1,0);
        iVar6 = sqlite3_step(psVar4);
        if (iVar6 == 100) {
          pVal = columnMem(psVar4,0);
          pvVar10 = sqlite3_value_blob(pVal);
          columnMallocFailure(psVar4);
          iVar6 = sqlite3_column_bytes(psVar4,0);
          if (iVar6 == 0) {
LAB_001d067b:
            uVar8 = (uint)uVar14;
          }
          else if ((-1 < *(char *)((long)pvVar10 + (long)iVar6 + -1)) && (0 < iVar6 && -2 < iVar9))
          {
            uVar14 = 0;
            iVar16 = 0;
            do {
              local_40 = &DAT_aaaaaaaaaaaaaaaa;
              iVar7 = sqlite3Fts3GetVarintU
                                ((char *)((long)iVar16 + (long)pvVar10),(sqlite_uint64 *)&local_40);
              __s[uVar14] = (uint)local_40;
              uVar14 = uVar14 + 1;
              if ((uVar1 & 0xffffffff) <= uVar14) break;
              iVar16 = iVar16 + iVar7;
            } while (iVar16 < iVar6);
            goto LAB_001d067b;
          }
          local_88 = (int)uVar1;
          if ((int)uVar8 < local_88) {
            memset(__s + uVar8,0,(ulong)(~uVar8 + local_88) * 4 + 4);
          }
        }
        else {
          memset(__s,0,uVar1 * 4);
        }
        iVar6 = sqlite3_reset(psVar4);
        if (iVar6 == 0) {
          if ((-1 < nChng) || (uVar8 = 0, (uint)-nChng <= *__s)) {
            uVar8 = nChng + *__s;
          }
          *__s = uVar8;
          if (-1 < p->nColumn) {
            lVar11 = -1;
            do {
              uVar8 = (aSzIns[lVar11 + 1] + __s[lVar11 + 2]) - aSzDel[lVar11 + 1];
              if (aSzIns[lVar11 + 1] + __s[lVar11 + 2] < aSzDel[lVar11 + 1]) {
                uVar8 = 0;
              }
              __s[lVar11 + 2] = uVar8;
              lVar11 = lVar11 + 1;
            } while (lVar11 < p->nColumn);
          }
          uVar14 = 0;
          if (-2 < iVar9) {
            uVar12 = 0;
            do {
              pbVar5 = (byte *)((long)(int)uVar14 + (long)(__s + uVar1));
              uVar15 = (ulong)__s[uVar12];
              do {
                pbVar13 = pbVar5;
                bVar3 = (byte)uVar15;
                *pbVar13 = bVar3 | 0x80;
                uVar8 = (int)uVar14 + 1;
                uVar14 = (ulong)uVar8;
                bVar2 = 0x7f < uVar15;
                pbVar5 = pbVar13 + 1;
                uVar15 = uVar15 >> 7;
              } while (bVar2);
              *pbVar13 = bVar3;
              uVar12 = uVar12 + 1;
            } while (uVar12 != (uVar1 & 0xffffffff));
            uVar14 = (ulong)(int)uVar8;
          }
          iVar9 = fts3SqlStmt(p,0x17,&local_48,(sqlite3_value **)0x0);
          psVar4 = local_48;
          if (iVar9 == 0) {
            sqlite3_bind_int64(local_48,1,0);
            bindText(psVar4,2,__s + uVar1,uVar14,(_func_void_void_ptr *)0x0,'\0');
            psVar4 = local_48;
            sqlite3_step(local_48);
            iVar9 = sqlite3_reset(psVar4);
            *pRC = iVar9;
            sqlite3_bind_null(psVar4,2);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              sqlite3_free(__s);
              return;
            }
            goto LAB_001d085f;
          }
          sqlite3_free(__s);
          *pRC = iVar9;
          goto LAB_001d06f4;
        }
      }
      sqlite3_free(__s);
      *pRC = iVar6;
    }
  }
LAB_001d06f4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_001d085f:
  __stack_chk_fail();
}

Assistant:

static void fts3UpdateDocTotals(
  int *pRC,                       /* The result code */
  Fts3Table *p,                   /* Table being updated */
  u32 *aSzIns,                    /* Size increases */
  u32 *aSzDel,                    /* Size decreases */
  int nChng                       /* Change in the number of documents */
){
  char *pBlob;             /* Storage for BLOB written into %_stat */
  int nBlob;               /* Size of BLOB written into %_stat */
  u32 *a;                  /* Array of integers that becomes the BLOB */
  sqlite3_stmt *pStmt;     /* Statement for reading and writing */
  int i;                   /* Loop counter */
  int rc;                  /* Result code from subfunctions */

  const int nStat = p->nColumn+2;

  if( *pRC ) return;
  a = sqlite3_malloc64( (sizeof(u32)+10)*(sqlite3_int64)nStat );
  if( a==0 ){
    *pRC = SQLITE_NOMEM;
    return;
  }
  pBlob = (char*)&a[nStat];
  rc = fts3SqlStmt(p, SQL_SELECT_STAT, &pStmt, 0);
  if( rc ){
    sqlite3_free(a);
    *pRC = rc;
    return;
  }
  sqlite3_bind_int(pStmt, 1, FTS_STAT_DOCTOTAL);
  if( sqlite3_step(pStmt)==SQLITE_ROW ){
    fts3DecodeIntArray(nStat, a,
         sqlite3_column_blob(pStmt, 0),
         sqlite3_column_bytes(pStmt, 0));
  }else{
    memset(a, 0, sizeof(u32)*(nStat) );
  }
  rc = sqlite3_reset(pStmt);
  if( rc!=SQLITE_OK ){
    sqlite3_free(a);
    *pRC = rc;
    return;
  }
  if( nChng<0 && a[0]<(u32)(-nChng) ){
    a[0] = 0;
  }else{
    a[0] += nChng;
  }
  for(i=0; i<p->nColumn+1; i++){
    u32 x = a[i+1];
    if( x+aSzIns[i] < aSzDel[i] ){
      x = 0;
    }else{
      x = x + aSzIns[i] - aSzDel[i];
    }
    a[i+1] = x;
  }
  fts3EncodeIntArray(nStat, a, pBlob, &nBlob);
  rc = fts3SqlStmt(p, SQL_REPLACE_STAT, &pStmt, 0);
  if( rc ){
    sqlite3_free(a);
    *pRC = rc;
    return;
  }
  sqlite3_bind_int(pStmt, 1, FTS_STAT_DOCTOTAL);
  sqlite3_bind_blob(pStmt, 2, pBlob, nBlob, SQLITE_STATIC);
  sqlite3_step(pStmt);
  *pRC = sqlite3_reset(pStmt);
  sqlite3_bind_null(pStmt, 2);
  sqlite3_free(a);
}